

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O2

int Gia_ManHashAndMulti(Gia_Man_t *p,Vec_Int_t *vLits)

{
  uint uVar1;
  int iVar2;
  int iLit1;
  uint uVar3;
  int iVar4;
  uint i;
  
  uVar1 = vLits->nSize;
  if (uVar1 == 0) {
    return 0;
  }
  while( true ) {
    if ((int)uVar1 < 2) {
      if (uVar1 != 1) {
        __assert_fail("Vec_IntSize(vLits) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                      ,799,"int Gia_ManHashAndMulti(Gia_Man_t *, Vec_Int_t *)");
      }
      iVar4 = Vec_IntEntry(vLits,0);
      return iVar4;
    }
    i = 0;
    for (iVar4 = 1; iVar4 < (int)uVar1; iVar4 = iVar4 + 2) {
      iVar2 = Vec_IntEntry(vLits,iVar4 + -1);
      iLit1 = Vec_IntEntry(vLits,iVar4);
      iVar2 = Gia_ManHashAnd(p,iVar2,iLit1);
      Vec_IntWriteEntry(vLits,i,iVar2);
      uVar1 = vLits->nSize;
      i = i + 1;
    }
    uVar3 = uVar1;
    if ((uVar1 & 1) != 0) {
      if ((int)uVar1 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
      }
      Vec_IntWriteEntry(vLits,i,vLits->pArray[(ulong)uVar1 - 1]);
      i = i + 1;
      uVar3 = vLits->nSize;
    }
    uVar1 = i;
    if ((int)uVar3 < (int)uVar1) break;
    vLits->nSize = uVar1;
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

int Gia_ManHashAndMulti( Gia_Man_t * p, Vec_Int_t * vLits )
{
    if ( Vec_IntSize(vLits) == 0 )
        return 0;
    while ( Vec_IntSize(vLits) > 1 )
    {
        int i, k = 0, Lit1, Lit2, LitRes;
        Vec_IntForEachEntryDouble( vLits, Lit1, Lit2, i )
        {
            LitRes = Gia_ManHashAnd( p, Lit1, Lit2 );
            Vec_IntWriteEntry( vLits, k++, LitRes );
        }
        if ( Vec_IntSize(vLits) & 1 )
            Vec_IntWriteEntry( vLits, k++, Vec_IntEntryLast(vLits) );
        Vec_IntShrink( vLits, k );
    }
    assert( Vec_IntSize(vLits) == 1 );
    return Vec_IntEntry(vLits, 0);
}